

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

Result * __thiscall
banksia::ChessBoard::probeSyzygy
          (Result *__return_storage_ptr__,ChessBoard *this,int maxPieces,bool *tberror)

{
  Side SVar1;
  pointer pPVar2;
  Piece PVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  uint64_t kings;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint64_t rooks;
  uint64_t bishops;
  char cVar11;
  long lVar12;
  uint64_t queens;
  uint64_t knights;
  uint64_t pawns;
  PieceType PVar13;
  uint64_t bm [2];
  uint results [193];
  
  *tberror = false;
  Result::Result(__return_storage_ptr__);
  if (((Tablebase::SyzygyTablebase::TB_LARGEST != 0) &&
      (iVar5 = toPieceCount(this,(int *)0x0), iVar5 <= maxPieces)) &&
     (iVar5 <= Tablebase::SyzygyTablebase::TB_LARGEST)) {
    bm[0] = 0;
    bm[1] = 0;
    pPVar2 = (this->super_BoardCore).pieces.
             super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)(this->super_BoardCore).pieces.
                   super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pPVar2 >> 3;
    lVar10 = 0;
    pawns = 0;
    knights = 0;
    bishops = 0;
    rooks = 0;
    queens = 0;
    kings = 0;
    do {
      if (lVar12 == lVar10) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   lVar10,lVar12);
      }
      PVar3 = pPVar2[lVar10];
      PVar13 = PVar3.type;
      if (PVar13 != empty) {
        uVar8 = 1L << (((byte)lVar10 ^ 0x38) & 0x3f);
        bm[(long)PVar3 >> 0x20] = bm[(long)PVar3 >> 0x20] | uVar8;
        switch(PVar13) {
        case king:
          kings = kings | uVar8;
          break;
        case queen:
          queens = queens | uVar8;
          break;
        case rook:
          rooks = rooks | uVar8;
          break;
        case bishop:
          bishops = bishops | uVar8;
          break;
        case knight:
          knights = knights | uVar8;
          break;
        case pawn:
          pawns = pawns | uVar8;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    uVar9 = (uint)this->castleRights[0];
    uVar6 = (uint)this->castleRights[1];
    bVar7 = true;
    if (uVar9 + uVar6 != 0) {
      cVar11 = ((this->CastleRight_short & uVar9) != 0) * '\x04';
      cVar4 = cVar11 + '\b';
      if ((this->CastleRight_long & uVar9) == 0) {
        cVar4 = cVar11;
      }
      bVar7 = ((this->CastleRight_short & uVar6) == 0 && cVar4 == '\0') &&
              (this->CastleRight_long & uVar6) == 0;
    }
    uVar6 = this->enpassant;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    else {
      uVar6 = ((uVar6 & 7) - (uVar6 & 0xf8)) + 0x38 & 0xff;
    }
    SVar1 = (this->super_BoardCore).side;
    uVar9 = 0xffffffff;
    if (bVar7) {
      uVar9 = Tablebase::SyzygyTablebase::tb_probe_root_impl
                        (bm[1],bm[0],kings,queens,rooks,bishops,knights,pawns,
                         (uint)(byte)(this->super_BoardCore).quietCnt,uVar6,SVar1 == white,results);
    }
    if (uVar9 == 0xffffffff) {
      *tberror = true;
    }
    else {
      uVar6 = 4 - (uVar9 & 0xf);
      if (SVar1 == white) {
        uVar6 = uVar9 & 0xf;
      }
      __return_storage_ptr__->result = probeSyzygy::typeArray[uVar6];
      __return_storage_ptr__->reason = adjudication;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result ChessBoard::probeSyzygy(int maxPieces, bool& tberror) const
{
    tberror = false;
    Result result;
    if (!Tablebase::SyzygyTablebase::TB_LARGEST) {
        return result;
    }
    
    auto total = toPieceCount(nullptr);
    if (total > maxPieces || total > Tablebase::SyzygyTablebase::TB_LARGEST) {
        return result;
    }
    
    SyzygyPos pos;
    memset(&pos, 0, sizeof(pos));
    
    uint64_t bm[2] = { 0, 0 };
    
    for(int i = 0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) continue;
        auto sd = static_cast<int>(piece.side);
        
        uint64_t b = 1ULL << ((7 - (i >> 3)) * 8 + (i & 0x7));
        bm[sd] |= b;
        
        switch (piece.type) {
            case PieceType::king:
                pos.kings |= b;
                break;
            case PieceType::queen:
                pos.queens |= b;
                break;
            case PieceType::rook:
                pos.rooks |= b;
                break;
            case PieceType::bishop:
                pos.bishops |= b;
                break;
            case PieceType::knight:
                pos.knights |= b;
                break;
            case PieceType::pawn:
                pos.pawns |= b;
                break;
                
            default:
                break;
        }
    }
    
    pos.white = bm[W];
    pos.black = bm[B];
    pos.turn = side == Side::white ? 1 : 0;
    
    if (castleRights[0] + castleRights[1]) {
        if (castleRights[B] & CastleRight_short) {
            pos.castling |= TB_CASTLING_k;
        }
        if (castleRights[B] & CastleRight_long) {
            pos.castling |= TB_CASTLING_q;
        }
        if (castleRights[W] & CastleRight_short) {
            pos.castling |= TB_CASTLING_K;
        }
        if (castleRights[W] & CastleRight_long) {
            pos.castling |= TB_CASTLING_Q;
        }
    }
    
    if (enpassant > 0) {
        pos.ep = (7 - (enpassant >> 3)) * 8 + (enpassant & 0x7);
    }
    
    pos.rule50 = quietCnt;
    
    unsigned results[TB_MAX_MOVES];
    unsigned res = Tablebase::SyzygyTablebase::tb_probe_root(pos.white, pos.black, pos.kings,
                                            pos.queens, pos.rooks, pos.bishops, pos.knights, pos.pawns,
                                            pos.rule50, pos.castling, pos.ep, pos.turn, results);
    if (res == TB_RESULT_FAILED)
    {
//        printOut();
//        std::cerr << "Error: unable to probe tablebase; position invalid, illegal or not in tablebase" << std::endl;
        tberror = true;
        return result;
    }
    
    // (3) Output:
    unsigned wdl = TB_GET_WDL(res);
    
    static const ResultType typeArray[] = {
        ResultType::loss,
        ResultType::draw, ResultType::draw, ResultType::draw,
        ResultType::win
    };
    
    result.result = typeArray[pos.turn? wdl: 4 - wdl];
    result.reason = ReasonType::adjudication;
    return result;
}